

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

bool __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::GetNextJointPolicyAndValueSpecific
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,
          shared_ptr<JointPolicyDiscretePure> *jpol,double *value)

{
  bool bVar1;
  byte bVar2;
  shared_ptr<JointPolicyDiscretePure> *psVar3;
  type pJVar4;
  type pPVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  ostream *poVar7;
  size_t sVar8;
  double *in_RDX;
  long *in_RDI;
  double dVar9;
  shared_ptr<PartialJPDPValuePair> jppv_1;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_00000080;
  shared_ptr<JPPVValuePair> jppv;
  bool foundSolution;
  shared_ptr<JointPolicyDiscretePure> *in_stack_ffffffffffffff38;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  shared_ptr<JointPolicyDiscretePure> *in_stack_ffffffffffffff50;
  undefined1 local_90 [32];
  shared_ptr<JointPolicyDiscretePure> local_70 [4];
  shared_ptr<JPPVValuePair> local_30 [23];
  byte local_19;
  double *local_18;
  
  local_18 = in_RDX;
  if ((*(byte *)(in_RDI + 0x24) & 1) == 0) {
    (**(code **)(*in_RDI + 0x20))();
  }
  else {
    ReSolve(in_stack_00000080);
  }
  local_19 = 0;
  bVar1 = BayesianGameIdenticalPayoffSolver::IsEmptyJPPV
                    ((BayesianGameIdenticalPayoffSolver *)0x15f0fe);
  if (bVar1) {
    bVar1 = BayesianGameIdenticalPayoffSolver::IsEmptyPJPDP
                      ((BayesianGameIdenticalPayoffSolver *)0x15f20b);
    if (bVar1) {
      boost::shared_ptr<JointPolicyDiscretePure>::reset(in_stack_ffffffffffffff50);
      *local_18 = 0.0;
    }
    else {
      psVar3 = local_70;
      BayesianGameIdenticalPayoffSolver::GetNextSolutionPJPDP
                ((BayesianGameIdenticalPayoffSolver *)in_stack_ffffffffffffff38);
      pPVar5 = boost::shared_ptr<PartialJPDPValuePair>::operator->
                         ((shared_ptr<PartialJPDPValuePair> *)psVar3);
      (**(code **)(*(long *)pPVar5 + 0x10))(local_90);
      boost::static_pointer_cast<JointPolicyDiscretePure,PartialJointPolicyDiscretePure>
                ((shared_ptr<PartialJointPolicyDiscretePure> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      psVar3 = boost::shared_ptr<JointPolicyDiscretePure>::operator=
                         (psVar3,(shared_ptr<JointPolicyDiscretePure> *)
                                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      bVar2 = boost::shared_ptr::operator_cast_to_bool((shared_ptr *)psVar3);
      boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
                ((shared_ptr<JointPolicyDiscretePure> *)0x15f27b);
      boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
                ((shared_ptr<PartialJointPolicyDiscretePure> *)0x15f285);
      if ((bVar2 & 1) != 0) {
        local_19 = 1;
        pPVar5 = boost::shared_ptr<PartialJPDPValuePair>::operator->
                           ((shared_ptr<PartialJPDPValuePair> *)local_70);
        in_stack_ffffffffffffff40 =
             (basic_ostream<char,_std::char_traits<char>_> *)(**(code **)(*(long *)pPVar5 + 0x18))()
        ;
        *local_18 = (double)in_stack_ffffffffffffff40;
        BayesianGameIdenticalPayoffSolver::PopNextSolutionPJPDP
                  ((BayesianGameIdenticalPayoffSolver *)0x15f2d1);
      }
      boost::shared_ptr<PartialJPDPValuePair>::~shared_ptr
                ((shared_ptr<PartialJPDPValuePair> *)0x15f2fc);
    }
  }
  else {
    BayesianGameIdenticalPayoffSolver::GetNextSolutionJPPV
              ((BayesianGameIdenticalPayoffSolver *)in_stack_ffffffffffffff38);
    boost::shared_ptr<JPPVValuePair>::operator->(local_30);
    JPPVValuePair::GetJPPV((JPPVValuePair *)in_stack_ffffffffffffff38);
    boost::static_pointer_cast<JointPolicyDiscretePure,JointPolicyPureVector>
              ((shared_ptr<JointPolicyPureVector> *)
               CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    psVar3 = boost::shared_ptr<JointPolicyDiscretePure>::operator=
                       (in_stack_ffffffffffffff50,
                        (shared_ptr<JointPolicyDiscretePure> *)
                        CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    bVar1 = boost::shared_ptr::operator_cast_to_bool((shared_ptr *)psVar3);
    boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<JointPolicyDiscretePure> *)0x15f172);
    boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
              ((shared_ptr<JointPolicyPureVector> *)0x15f17c);
    if (bVar1) {
      local_19 = 1;
      pJVar4 = boost::shared_ptr<JPPVValuePair>::operator->(local_30);
      dVar9 = (double)(**(code **)(*(long *)pJVar4 + 0x18))();
      *local_18 = dVar9;
      BayesianGameIdenticalPayoffSolver::PopNextSolutionJPPV
                ((BayesianGameIdenticalPayoffSolver *)0x15f1cb);
    }
    boost::shared_ptr<JPPVValuePair>::~shared_ptr((shared_ptr<JPPVValuePair> *)0x15f1fc);
  }
  if (-1 < (int)in_RDI[0x22]) {
    std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound found jpol ");
    pbVar6 = boost::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    poVar7 = std::operator<<((ostream *)pbVar6," value ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*local_18);
    poVar7 = std::operator<<(poVar7," and ");
    sVar8 = BayesianGameIdenticalPayoffSolver::GetNrFoundSolutions
                      ((BayesianGameIdenticalPayoffSolver *)0x15f392);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar8);
    poVar7 = std::operator<<(poVar7," solutions left");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  in_RDI[0x23] = in_RDI[0x23] + 1;
  return (bool)(local_19 & 1);
}

Assistant:

bool GetNextJointPolicyAndValueSpecific(boost::shared_ptr<JointPolicyDiscretePure> &jpol, double &value)
    {
        // If we never solved this BG, do that now
        if(!_m_solved)
            Solve();
        // even if we have more solutions stored in the solution queue, we
        // don't know whether they are optimal, so we need to resolve to
        // make sure
        else
            ReSolve();

        bool foundSolution=false;

        // this requires some magic to make sure we return from
        // the correct pool, which depends on the JP type
        if(!this->IsEmptyJPPV())
        {                
            const boost::shared_ptr<JPPVValuePair> jppv=
                this->GetNextSolutionJPPV();
            //if((jpol=boost::dynamic_pointer_cast<JP>(jppv->GetJPPV())))
            if((jpol=boost::static_pointer_cast<JointPolicyDiscretePure>(jppv->GetJPPV())))
            {
                foundSolution=true;
                value=jppv->GetValue();
                this->PopNextSolutionJPPV();
            }
        }
        else if(!this->IsEmptyPJPDP())
        {
            boost::shared_ptr<PartialJPDPValuePair> jppv=
                this->GetNextSolutionPJPDP();
            //if((jpol=boost::dynamic_pointer_cast<JP>(jppv->GetJPol())))
            if((jpol=boost::static_pointer_cast<JointPolicyDiscretePure>(jppv->GetJPol())))
            {
                foundSolution=true;
                value=jppv->GetValue();
                this->PopNextSolutionPJPDP();
            }
        }
        else
        {
            jpol.reset();
            value=0;
        }
        if(_m_verbosity>=0)
            std::cout << "BGIP_SolverBranchAndBound found jpol "
                      << jpol << " value " << value << " and " 
                      << this->GetNrFoundSolutions()
                      << " solutions left" 
                      << std::endl;
        _m_nrSolutionsComputed++;

        return(foundSolution);
    }